

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O1

void __thiscall
tcu::TestPackageDescriptor::TestPackageDescriptor
          (TestPackageDescriptor *this,char *name,TestPackageCreateFunc createFunc)

{
  if (TestPackageRegistry::getOrDestroy::s_ptr == (TestPackageRegistry *)0x0) {
    TestPackageRegistry::getOrDestroy::s_ptr = (TestPackageRegistry *)operator_new(0x18);
    (TestPackageRegistry::getOrDestroy::s_ptr->m_packageInfos).
    super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (TestPackageRegistry::getOrDestroy::s_ptr->m_packageInfos).
    super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (TestPackageRegistry::getOrDestroy::s_ptr->m_packageInfos).
    super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  TestPackageRegistry::registerPackage(TestPackageRegistry::getOrDestroy::s_ptr,name,createFunc);
  return;
}

Assistant:

TestPackageDescriptor::TestPackageDescriptor (const char* name, TestPackageCreateFunc createFunc)
{
	TestPackageRegistry::getSingleton()->registerPackage(name, createFunc);
}